

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O0

int __thiscall data_structures::SymbolTable<int,_int>::get(SymbolTable<int,_int> *this,int *key)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  out_of_range *this_00;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *local_20;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *node;
  int *key_local;
  SymbolTable<int,_int> *this_local;
  
  local_20 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::begin(&this->_list);
  while( true ) {
    pLVar1 = LinkedList<data_structures::SymbolTableElement<int,_int>_>::end(&this->_list);
    if (local_20 == pLVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Key error, no such key in this table !");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if ((local_20->element).key == *key) break;
    local_20 = ListNode<data_structures::SymbolTableElement<int,_int>_>::next(local_20);
  }
  return (local_20->element).value;
}

Assistant:

inline
    Value SymbolTable<Key, Value>::get(const Key &key){
        for (auto node = _list.begin(); node != _list.end(); node = node->next()) {
            if (node->element.key == key) {
                return node->element.value;
            }
        }
        throw std::out_of_range("Key error, no such key in this table !");
    }